

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_pCAL(png_const_structrp png_ptr,png_inforp info_ptr,png_const_charp purpose,
                 png_int_32 X0,png_int_32 X1,int type,int nparams,png_const_charp units,
                 png_charpp params)

{
  png_const_charp string;
  int iVar1;
  size_t sVar2;
  size_t size;
  png_charp pcVar3;
  png_charpp ppcVar4;
  char *pcVar5;
  int local_3c;
  int i;
  size_t length;
  int type_local;
  png_int_32 X1_local;
  png_int_32 X0_local;
  png_const_charp purpose_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if (((((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) &&
       (purpose != (png_const_charp)0x0)) && (units != (png_const_charp)0x0)) &&
     ((nparams < 1 || (params != (png_charpp)0x0)))) {
    sVar2 = strlen(purpose);
    if ((type < 0) || (3 < type)) {
      png_chunk_report(png_ptr,"Invalid pCAL equation type",1);
    }
    else if ((nparams < 0) || (0xff < nparams)) {
      png_chunk_report(png_ptr,"Invalid pCAL parameter count",1);
    }
    else {
      for (local_3c = 0; local_3c < nparams; local_3c = local_3c + 1) {
        if (params[local_3c] == (char *)0x0) {
LAB_0012a938:
          png_chunk_report(png_ptr,"Invalid format for pCAL parameter",1);
          return;
        }
        string = params[local_3c];
        size = strlen(params[local_3c]);
        iVar1 = png_check_fp_string(string,size);
        if (iVar1 == 0) goto LAB_0012a938;
      }
      pcVar3 = (png_charp)png_malloc_warn(png_ptr,sVar2 + 1);
      info_ptr->pcal_purpose = pcVar3;
      if (info_ptr->pcal_purpose == (png_charp)0x0) {
        png_chunk_report(png_ptr,"Insufficient memory for pCAL purpose",1);
      }
      else {
        memcpy(info_ptr->pcal_purpose,purpose,sVar2 + 1);
        info_ptr->pcal_X0 = X0;
        info_ptr->pcal_X1 = X1;
        info_ptr->pcal_type = (png_byte)type;
        info_ptr->pcal_nparams = (png_byte)nparams;
        sVar2 = strlen(units);
        pcVar3 = (png_charp)png_malloc_warn(png_ptr,sVar2 + 1);
        info_ptr->pcal_units = pcVar3;
        if (info_ptr->pcal_units == (png_charp)0x0) {
          png_warning(png_ptr,"Insufficient memory for pCAL units");
        }
        else {
          memcpy(info_ptr->pcal_units,units,sVar2 + 1);
          ppcVar4 = (png_charpp)png_malloc_warn(png_ptr,(ulong)(nparams + 1) << 3);
          info_ptr->pcal_params = ppcVar4;
          if (info_ptr->pcal_params == (png_charpp)0x0) {
            png_warning(png_ptr,"Insufficient memory for pCAL params");
          }
          else {
            memset(info_ptr->pcal_params,0,(ulong)(nparams + 1) << 3);
            for (local_3c = 0; local_3c < nparams; local_3c = local_3c + 1) {
              sVar2 = strlen(params[local_3c]);
              pcVar5 = (char *)png_malloc_warn(png_ptr,sVar2 + 1);
              info_ptr->pcal_params[local_3c] = pcVar5;
              if (info_ptr->pcal_params[local_3c] == (char *)0x0) {
                png_warning(png_ptr,"Insufficient memory for pCAL parameter");
                return;
              }
              memcpy(info_ptr->pcal_params[local_3c],params[local_3c],sVar2 + 1);
            }
            info_ptr->valid = info_ptr->valid | 0x400;
            info_ptr->free_me = info_ptr->free_me | 0x80;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_pCAL(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_charp purpose, png_int_32 X0, png_int_32 X1, int type,
    int nparams, png_const_charp units, png_charpp params)
{
   size_t length;
   int i;

   png_debug1(1, "in %s storage function", "pCAL");

   if (png_ptr == NULL || info_ptr == NULL || purpose == NULL || units == NULL
       || (nparams > 0 && params == NULL))
      return;

   length = strlen(purpose) + 1;
   png_debug1(3, "allocating purpose for info (%lu bytes)",
       (unsigned long)length);

   /* TODO: validate format of calibration name and unit name */

   /* Check that the type matches the specification. */
   if (type < 0 || type > 3)
   {
      png_chunk_report(png_ptr, "Invalid pCAL equation type",
            PNG_CHUNK_WRITE_ERROR);
      return;
   }

   if (nparams < 0 || nparams > 255)
   {
      png_chunk_report(png_ptr, "Invalid pCAL parameter count",
            PNG_CHUNK_WRITE_ERROR);
      return;
   }

   /* Validate params[nparams] */
   for (i=0; i<nparams; ++i)
   {
      if (params[i] == NULL ||
          !png_check_fp_string(params[i], strlen(params[i])))
      {
         png_chunk_report(png_ptr, "Invalid format for pCAL parameter",
               PNG_CHUNK_WRITE_ERROR);
         return;
      }
   }

   info_ptr->pcal_purpose = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, length));

   if (info_ptr->pcal_purpose == NULL)
   {
      png_chunk_report(png_ptr, "Insufficient memory for pCAL purpose",
            PNG_CHUNK_WRITE_ERROR);
      return;
   }

   memcpy(info_ptr->pcal_purpose, purpose, length);

   png_debug(3, "storing X0, X1, type, and nparams in info");
   info_ptr->pcal_X0 = X0;
   info_ptr->pcal_X1 = X1;
   info_ptr->pcal_type = (png_byte)type;
   info_ptr->pcal_nparams = (png_byte)nparams;

   length = strlen(units) + 1;
   png_debug1(3, "allocating units for info (%lu bytes)",
       (unsigned long)length);

   info_ptr->pcal_units = png_voidcast(png_charp,
       png_malloc_warn(png_ptr, length));

   if (info_ptr->pcal_units == NULL)
   {
      png_warning(png_ptr, "Insufficient memory for pCAL units");

      return;
   }

   memcpy(info_ptr->pcal_units, units, length);

   info_ptr->pcal_params = png_voidcast(png_charpp, png_malloc_warn(png_ptr,
       (size_t)(((unsigned int)nparams + 1) * (sizeof (png_charp)))));

   if (info_ptr->pcal_params == NULL)
   {
      png_warning(png_ptr, "Insufficient memory for pCAL params");

      return;
   }

   memset(info_ptr->pcal_params, 0, ((unsigned int)nparams + 1) *
       (sizeof (png_charp)));

   for (i = 0; i < nparams; i++)
   {
      length = strlen(params[i]) + 1;
      png_debug2(3, "allocating parameter %d for info (%lu bytes)", i,
          (unsigned long)length);

      info_ptr->pcal_params[i] = (png_charp)png_malloc_warn(png_ptr, length);

      if (info_ptr->pcal_params[i] == NULL)
      {
         png_warning(png_ptr, "Insufficient memory for pCAL parameter");

         return;
      }

      memcpy(info_ptr->pcal_params[i], params[i], length);
   }

   info_ptr->valid |= PNG_INFO_pCAL;
   info_ptr->free_me |= PNG_FREE_PCAL;
}